

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

VisitError<int> * __thiscall
Fixpp::TypedParsingContext<int>::toVisitError
          (VisitError<int> *__return_storage_ptr__,TypedParsingContext<int> *this)

{
  bool bVar1;
  Ok<int> ok;
  ErrorKind *this_00;
  int *val;
  ErrorKind *val_00;
  Err<Fixpp::ErrorKind> local_48;
  TypedParsingContext<int> *local_18;
  TypedParsingContext<int> *this_local;
  
  local_18 = this;
  this_local = (TypedParsingContext<int> *)__return_storage_ptr__;
  bVar1 = ParsingContext::hasError(&this->super_ParsingContext);
  if (bVar1) {
    this_00 = Deferred<Fixpp::ErrorKind>::get(&(this->super_ParsingContext).error);
    Fixpp::result::Err<Fixpp::ErrorKind_const&,Fixpp::ErrorKind>(&local_48,(result *)this_00,val_00)
    ;
    Fixpp::result::Result<int,_Fixpp::ErrorKind>::Result(__return_storage_ptr__,&local_48);
    Fixpp::result::types::Err<Fixpp::ErrorKind>::~Err(&local_48);
  }
  else {
    val = Deferred<int>::get(&this->resultValue);
    ok = Fixpp::result::Ok<int_const&,int>(val);
    Fixpp::result::Result<int,_Fixpp::ErrorKind>::Result(__return_storage_ptr__,ok);
  }
  return __return_storage_ptr__;
}

Assistant:

VisitError<T> toVisitError() const
        {
            if (hasError())
                return result::Err(error.get());
            return result::Ok(resultValue.get());
        }